

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

var __thiscall cs::runtime_type::parse_minus(runtime_type *this,var *b)

{
  char *__s1;
  int iVar1;
  undefined4 extraout_var;
  undefined *puVar2;
  numeric *pnVar3;
  runtime_error *this_00;
  any *in_RDX;
  bool bVar4;
  anon_union_16_2_310e9938_for_data local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  if (in_RDX->mDat == (proxy *)0x0) {
    puVar2 = &void::typeinfo;
  }
  else {
    iVar1 = (*in_RDX->mDat->data->_vptr_baseHolder[2])();
    puVar2 = (undefined *)CONCAT44(extraout_var,iVar1);
  }
  __s1 = *(char **)(puVar2 + 8);
  if (__s1 != "N2cs7numericE") {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,"N2cs7numericE");
      if (iVar1 == 0) goto LAB_0013295e;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_38._int = (numeric_integer)&local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Unsupported operator operations(Minus).","");
    runtime_error::runtime_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
LAB_0013295e:
  pnVar3 = cs_impl::any::const_val<cs::numeric>(in_RDX);
  bVar4 = pnVar3->type != true;
  if (bVar4) {
    local_38._0_10_ = -*(longdouble *)&pnVar3->data;
  }
  else {
    local_38._int = -(pnVar3->data)._int;
  }
  local_28._M_local_buf[0] = !bVar4;
  cs_impl::any::any<cs::numeric>((any *)this,(numeric *)&local_38);
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_minus(const var &b)
	{
		if (b.type() == typeid(numeric))
			return -b.const_val<numeric>();
		else
			throw runtime_error("Unsupported operator operations(Minus).");
	}